

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo4.cpp
# Opt level: O0

void (anonymous_namespace)::cross_off<std::vector<char,std::allocator<char>>>
               (int64_t prime,int64_t low,int64_t high,int64_t *next_multiple,
               vector<char,_std::allocator<char>_> *sieve,BinaryIndexedTree *tree)

{
  reference pvVar1;
  long *in_RCX;
  long in_RDX;
  BinaryIndexedTree *in_RSI;
  long in_RDI;
  vector<char,_std::allocator<char>_> *in_R8;
  int64_t m;
  undefined8 local_38;
  
  for (local_38 = *in_RCX; local_38 < in_RDX; local_38 = in_RDI * 2 + local_38) {
    pvVar1 = std::vector<char,_std::allocator<char>_>::operator[](in_R8,local_38 - (long)in_RSI);
    if (*pvVar1 != '\0') {
      pvVar1 = std::vector<char,_std::allocator<char>_>::operator[](in_R8,local_38 - (long)in_RSI);
      *pvVar1 = '\0';
      primesum::BinaryIndexedTree::update(in_RSI,in_RDX,(int64_t)in_RCX);
    }
  }
  *in_RCX = local_38;
  return;
}

Assistant:

void cross_off(int64_t prime,
               int64_t low,
               int64_t high,
               int64_t& next_multiple,
               T& sieve,
               BinaryIndexedTree& tree)
{
  int64_t m = next_multiple;

  for (; m < high; m += prime * 2)
  {
    if (sieve[m - low])
    {
      sieve[m - low] = 0;
      tree.update(m, low);
    }
  }

  next_multiple = m;
}